

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O3

int raplcap_pd_get_limits
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_limit *limit_long,
              raplcap_limit *limit_short)

{
  int iVar1;
  raplcap_msr *ctx;
  int *piVar2;
  int iVar3;
  uint64_t msrval;
  uint64_t local_38;
  
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    iVar3 = -1;
    if (-1 < ZONE_OFFSETS_PL[zone] && ctx != (raplcap_msr *)0x0) {
      iVar1 = msr_sys_read(ctx->sys,&local_38,pkg,die,ZONE_OFFSETS_PL[zone]);
      if (iVar1 == 0) {
        msr_get_limits(&ctx->ctx,zone,local_38,limit_long,limit_short);
        iVar3 = 0;
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int raplcap_pd_get_limits(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                          raplcap_limit* limit_long, raplcap_limit* limit_short) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_pd_get_limits: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msr_get_limits(&state->ctx, zone, msrval, limit_long, limit_short);
  return 0;
}